

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_test.cc
# Opt level: O2

void __thiscall
RegisterCanonicalizePathNotNullTerminated::RegisterCanonicalizePathNotNullTerminated
          (RegisterCanonicalizePathNotNullTerminated *this)

{
  RegisterTest(CanonicalizePathNotNullTerminated::Create,"CanonicalizePath.NotNullTerminated");
  return;
}

Assistant:

TEST(CanonicalizePath, NotNullTerminated) {
  string path;
  size_t len;
  uint64_t unused;

  path = "foo/. bar/.";
  len = strlen("foo/.");  // Canonicalize only the part before the space.
  CanonicalizePath(&path[0], &len, &unused);
  EXPECT_EQ(strlen("foo"), len);
  EXPECT_EQ("foo/. bar/.", string(path));

  path = "foo/../file bar/.";
  len = strlen("foo/../file");
  CanonicalizePath(&path[0], &len, &unused);
  EXPECT_EQ(strlen("file"), len);
  EXPECT_EQ("file ./file bar/.", string(path));
}